

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand
          (cmGlobalUnixMakefileGenerator3 *this,string *sourceFile,string *workingDirectory,
          string *compileCommand)

{
  cmake *this_00;
  string *psVar1;
  cmGeneratedFileStream *this_01;
  ostream *poVar2;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string commandDatabaseName;
  string *compileCommand_local;
  string *workingDirectory_local;
  string *sourceFile_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  commandDatabaseName.field_2._8_8_ = compileCommand;
  if (this->CommandDatabase == (cmGeneratedFileStream *)0x0) {
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&local_68,(string *)psVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,"/compile_commands.json");
    std::__cxx11::string::~string((string *)&local_68);
    this_01 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_01,(string *)local_48,false,None);
    this->CommandDatabase = this_01;
    poVar2 = std::operator<<((ostream *)this->CommandDatabase,"[");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    poVar2 = std::operator<<((ostream *)this->CommandDatabase,",");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)this->CommandDatabase,"{");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_98,workingDirectory);
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  poVar2 = std::operator<<(poVar2,"\",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_b8,(string *)commandDatabaseName.field_2._8_8_);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  poVar2 = std::operator<<(poVar2,"\",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_d8,sourceFile);
  poVar2 = std::operator<<(poVar2,(string *)&local_d8);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand(
  const std::string& sourceFile, const std::string& workingDirectory,
  const std::string& compileCommand)
{
  if (this->CommandDatabase == nullptr) {
    std::string commandDatabaseName =
      std::string(this->GetCMakeInstance()->GetHomeOutputDirectory()) +
      "/compile_commands.json";
    this->CommandDatabase = new cmGeneratedFileStream(commandDatabaseName);
    *this->CommandDatabase << "[" << std::endl;
  } else {
    *this->CommandDatabase << "," << std::endl;
  }
  *this->CommandDatabase << "{" << std::endl
                         << "  \"directory\": \""
                         << cmGlobalGenerator::EscapeJSON(workingDirectory)
                         << "\"," << std::endl
                         << "  \"command\": \""
                         << cmGlobalGenerator::EscapeJSON(compileCommand)
                         << "\"," << std::endl
                         << "  \"file\": \""
                         << cmGlobalGenerator::EscapeJSON(sourceFile) << "\""
                         << std::endl
                         << "}";
}